

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi2skini.cpp
# Opt level: O2

void usage(char *command)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Usage: ");
  poVar1 = std::operator<<(poVar1,command);
  std::operator<<(poVar1," [-t #|-m #] midifile\n");
  std::operator<<((ostream *)&std::cout,
                  "   -t #  == extract only specified track (offset from 0).\n");
  std::operator<<((ostream *)&std::cout,"   -m #  == number of events to allocate for MIDI \n");
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  return;
}

Assistant:

void usage(const char* command) {
   cout << "Usage: " << command << " [-t #|-m #] midifile\n";
   cout << "   -t #  == extract only specified track (offset from 0).\n";
   cout << "   -m #  == number of events to allocate for MIDI \n";
   cout << endl;
}